

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_case21.c
# Opt level: O2

void case21_set_ext_params(xc_func_type *p,double *ext_params)

{
  undefined8 *puVar1;
  int k;
  long lVar2;
  
  puVar1 = (undefined8 *)p->params;
  *puVar1 = 0xa00000003;
  for (lVar2 = 0; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    puVar1[lVar2 + 1] = (double)(int)lVar2 * 0.14285714285714285 + -0.42857142857142855;
  }
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    puVar1[lVar2 + 0xf] = ext_params[lVar2];
  }
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    puVar1[lVar2 + 0x19] = ext_params[lVar2 + 10];
  }
  puVar1[0x23] = ext_params[0x14];
  puVar1[0x24] = ext_params[0x15];
  puVar1[0x25] = ext_params[0x16];
  set_ext_params_exx(p,ext_params);
  return;
}

Assistant:

static void
case21_set_ext_params(xc_func_type *p, const double *ext_params)
{
  assert(p != NULL);
  hyb_gga_xc_case21_params * params = (hyb_gga_xc_case21_params *) p->params;

  /* Set internal parameters */
  params->k = 3;
  params->Nsp = 10;
  double qmin = -params->k*1.0/(params->Nsp - params->k);
  double qmax = params->Nsp*1.0/(params->Nsp - params->k);
  int nknots = params->Nsp + params->k + 1;
  double dq  = (qmax - qmin)/(nknots-1);
  for(int k=0; k<nknots; k++) {
    params->knots[k] = qmin+k*dq;
  }

  /* External parameters */
  for(int i=0;i<params->Nsp;i++)
    params->cx[i] = ext_params[i];
  for(int i=0;i<params->Nsp;i++)
    params->cc[i] = ext_params[i + params->Nsp];
  params->gammax = ext_params[2*params->Nsp];
  params->gammac = ext_params[2*params->Nsp+1];
  params->ax = ext_params[2*params->Nsp+2];

  /* Exact exchange */
  set_ext_params_exx(p, ext_params);
}